

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O0

void * deallocmem(memory *m,int elemsize)

{
  void *pvVar1;
  int elemsize_local;
  memory *m_local;
  
  if (m->first < m->current) {
    m->current = (void *)((long)m->current - (long)elemsize);
  }
  else {
    m->nr = m->nr + -1;
    if (m->nr < 0) {
      m->last = (void *)0x0;
      m->first = (void *)0x0;
      m->current = (void *)0x0;
    }
    else {
      m->first = m->block[m->nr];
      pvVar1 = (void *)((long)m->first + ((long)m->blocksize - (long)elemsize));
      m->last = pvVar1;
      m->current = pvVar1;
    }
  }
  return m->current;
}

Assistant:

void *deallocmem(memory *m, int elemsize)
{
   if (m->current > m->first)
      m->current = (void *) ((char *) (m->current) - elemsize);
   else {
      m->nr--;
      if (m->nr >= 0) {
         m->first = m->block[m->nr];
         m->current = m->last = (void *)
            ((char *) (m->first) + m->blocksize - elemsize);
      } else
         m->current = m->first = m->last = NULL;
   }
   return m->current;
}